

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O0

void printPath(Path *path)

{
  uint local_1c;
  TileNode *pTStack_18;
  int i;
  TileNode *nextNode;
  Path *path_local;
  
  pTStack_18 = path->first;
  printf("\n\n#### PRINTING PATH ####\n\n");
  for (local_1c = 0; local_1c < path->count; local_1c = local_1c + 1) {
    printf("Location: %d :",(ulong)(uint)pTStack_18->location);
    printf("Type: %c\n",(ulong)(uint)(int)pTStack_18->type);
    pTStack_18 = pTStack_18->next;
  }
  printf("\n########################\n");
  return;
}

Assistant:

void printPath(struct Path *path) {
    struct TileNode *nextNode;

    nextNode = path->first;
    printf("\n\n#### PRINTING PATH ####\n\n");
    for (int i = 0; i < path->count; i++) {
        printf("Location: %d :", nextNode->location);
        printf("Type: %c\n", nextNode->type);
        nextNode = nextNode->next;
    }
    printf("\n########################\n");
}